

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

bool CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_Parse
               (ConstStringParam name,VisionFeaturePrint_Scene_SceneVersion *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  VisionFeaturePrint_Scene_SceneVersion local_1c;
  bool success;
  VisionFeaturePrint_Scene_SceneVersion *pVStack_18;
  int int_value;
  VisionFeaturePrint_Scene_SceneVersion *value_local;
  ConstStringParam name_local;
  
  pVStack_18 = value;
  value_local = (VisionFeaturePrint_Scene_SceneVersion *)name;
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,name);
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)VisionFeaturePrint_Scene_SceneVersion_entries,(EnumEntry *)0x3,
                     (size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pVStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool VisionFeaturePrint_Scene_SceneVersion_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, VisionFeaturePrint_Scene_SceneVersion* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      VisionFeaturePrint_Scene_SceneVersion_entries, 3, name, &int_value);
  if (success) {
    *value = static_cast<VisionFeaturePrint_Scene_SceneVersion>(int_value);
  }
  return success;
}